

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

int __thiscall
slang::SmallVectorBase<slang::ast::StreamingConcatenationExpression::StreamExpression>::copy
          (SmallVectorBase<slang::ast::StreamingConcatenationExpression::StreamExpression> *this,
          EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  size_type sVar1;
  Expression *pEVar2;
  byte *pbVar3;
  byte *pbVar4;
  pointer pSVar5;
  byte *pbVar6;
  pointer pSVar7;
  byte *pbVar8;
  
  sVar1 = this->len;
  if (sVar1 == 0) {
    return 0;
  }
  pbVar3 = (byte *)(*(long *)(*(long *)dst + 8) + 7U & 0xfffffffffffffff8);
  pbVar6 = pbVar3 + sVar1 * 0x18;
  if (*(byte **)(dst + 8) < pbVar6) {
    pbVar4 = BumpAllocator::allocateSlow((BumpAllocator *)dst,sVar1 * 0x18,8);
    sVar1 = this->len;
    if (sVar1 == 0) goto LAB_0043fb18;
    pSVar5 = this->data_;
    pSVar7 = pSVar5 + sVar1;
    pbVar6 = pbVar4 + sVar1 * 0x18;
    pbVar3 = pbVar4;
  }
  else {
    *(byte **)(*(long *)dst + 8) = pbVar6;
    pSVar5 = this->data_;
    pSVar7 = pSVar5 + sVar1;
    pbVar4 = pbVar3;
  }
  do {
    pbVar8 = pbVar3 + 0x18;
    *(_Optional_payload_base<unsigned_int> *)(pbVar3 + 0x10) =
         (pSVar5->constantWithWidth).super__Optional_base<unsigned_int,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_int>;
    pEVar2 = pSVar5->withExpr;
    *(Expression **)pbVar3 = (pSVar5->operand).ptr;
    *(Expression **)(pbVar3 + 8) = pEVar2;
    if (pSVar5 + 1 == pSVar7) break;
    pSVar5 = pSVar5 + 1;
    pbVar3 = pbVar8;
  } while (pbVar8 != pbVar6);
LAB_0043fb18:
  return (int)pbVar4;
}

Assistant:

[[nodiscard]] std::span<T> copy(BumpAllocator& alloc) const {
        if (len == 0)
            return {};

        pointer dest = reinterpret_cast<pointer>(alloc.allocate(len * sizeof(T), alignof(T)));
        std::ranges::uninitialized_copy(begin(), end(), dest, dest + len);

        return std::span<T>(dest, len);
    }